

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O1

void CheckStackTrace4(int i)

{
  int iVar1;
  void *ra;
  CheckOpString local_70;
  LogMessage local_68;
  
  if (expected_range[2].start < ra) {
    local_70.str_ = (string *)0x0;
  }
  else {
    local_70.str_ =
         google::MakeCheckOpString<void_const*,void*>
                   (&expected_range[2].start,(void **)&stack0xffffffffffffff88,
                    "(&expected_range[2])->start < ra");
  }
  if (local_70.str_ == (string *)0x0) {
    if (expected_range[2].end < ra) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[2].start);
      expected_range[2].end = ra;
    }
    expected_range[1].start = (void *)0x108e5b;
    expected_range[1].end = (void *)0x108e6c;
    if (-1 < i) {
      iVar1 = i + 1;
      do {
        CheckStackTraceLeaf();
        iVar1 = iVar1 + -1;
      } while (0 < iVar1);
    }
    return;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
             ,0xab,&local_70);
  google::LogMessage::stream(&local_68);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTrace4(int i) {
  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[2]);
  INIT_ADDRESS_RANGE(CheckStackTrace4, start, end, &expected_range[1]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTraceLeaf();
  }
  DECLARE_ADDRESS_LABEL(end);
}